

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_left_predictor_8x4_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  uint uVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  uint6 uVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  ushort uVar15;
  undefined8 uVar16;
  ushort uVar24;
  ushort uVar26;
  undefined1 auVar17 [16];
  ushort uVar27;
  ushort uVar28;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 uVar23;
  byte bVar25;
  
  uVar1 = *(ulong *)left;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  auVar10._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar10[0] = (char)(uVar1 >> 0x18);
  auVar10._9_6_ = 0;
  auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
  auVar11[0] = (char)(uVar1 >> 0x10);
  auVar11._11_4_ = 0;
  auVar17._3_12_ = SUB1512(auVar11 << 0x20,3);
  auVar17[2] = (char)(uVar1 >> 8);
  auVar17[0] = (byte)uVar1;
  auVar17[1] = 0;
  auVar17[0xf] = 0;
  auVar17 = psadbw(auVar17,(undefined1  [16])0x0);
  uVar15 = auVar17._0_2_ + 2;
  uVar24 = auVar17._2_2_ + 2;
  uVar26 = auVar17._4_2_ + 2;
  uVar27 = auVar17._6_2_ + 2;
  auVar19._0_2_ = uVar15 >> 2;
  uVar28 = uVar27 >> 2;
  uVar9 = CONCAT22((ushort)(auVar17._8_2_ + 2U) >> 2,uVar28);
  auVar20._0_9_ = (unkuint9)uVar9 << 0x30;
  uVar12 = CONCAT24((ushort)(auVar17._10_2_ + 2U) >> 2,uVar9);
  auVar13._6_5_ = 0;
  auVar13._0_6_ = uVar12;
  auVar21._0_11_ = auVar13 << 0x30;
  uVar1 = CONCAT26((ushort)(auVar17._12_2_ + 2U) >> 2,uVar12);
  auVar14._8_5_ = 0;
  auVar14._0_8_ = uVar1;
  auVar22._0_13_ = auVar14 << 0x30;
  bVar25 = (byte)(uVar27 >> 8);
  auVar22._14_2_ = (undefined2)(CONCAT19(bVar25 >> 2,CONCAT18(bVar25 >> 2,uVar1)) >> 0x40);
  auVar22[0xd] = (char)uVar28;
  bVar25 = (byte)(uVar26 >> 10);
  auVar21._12_4_ = (undefined4)(CONCAT37(auVar22._13_3_,CONCAT16((char)uVar28,uVar12)) >> 0x30);
  auVar21[0xb] = bVar25;
  uVar23 = (undefined1)(uVar26 >> 2);
  auVar20._10_6_ = (undefined6)(CONCAT55(auVar21._11_5_,CONCAT14(bVar25,uVar9)) >> 0x20);
  auVar20[9] = uVar23;
  bVar25 = (byte)(uVar24 >> 10);
  auVar19._8_8_ = (undefined8)(CONCAT73(auVar20._9_7_,CONCAT12(uVar23,uVar28)) >> 0x10);
  auVar19[7] = bVar25;
  auVar19[6] = bVar25;
  uVar23 = (undefined1)(uVar24 >> 2);
  auVar19[5] = uVar23;
  auVar19[4] = uVar23;
  bVar25 = (byte)(uVar15 >> 8);
  auVar19[3] = bVar25 >> 2;
  auVar19[2] = bVar25 >> 2;
  auVar18[0] = (undefined1)auVar19._0_2_;
  auVar18._2_14_ = auVar19._2_14_;
  auVar18[1] = auVar18[0];
  auVar17 = pshuflw(auVar18,auVar18,0);
  uVar16 = auVar17._0_8_;
  *(undefined8 *)dst = uVar16;
  *(undefined8 *)(dst + stride) = uVar16;
  *(undefined8 *)(dst + stride * 2) = uVar16;
  *(undefined8 *)(dst + stride * 3) = uVar16;
  return;
}

Assistant:

void aom_dc_left_predictor_8x4_sse2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_4(left);
  const __m128i two = _mm_set1_epi16(2);
  sum_left = _mm_add_epi16(sum_left, two);
  sum_left = _mm_srai_epi16(sum_left, 2);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  const __m128i row = _mm_shufflelo_epi16(sum_left, 0);
  dc_store_8xh(&row, 4, dst, stride);
}